

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall InlineeFrameInfo::Dump(InlineeFrameInfo *this)

{
  InlineeFrameInfo *this_local;
  
  Output::Print(L"func: ");
  if ((this->function).type == InlineeFrameInfoValueType_Const) {
    Output::Print(L"%p(Var) ",(ulong)(this->function).field_1.sym & 0xff,
                  (this->function).field_1.constValue.u);
  }
  else if ((this->function).type == InlineeFrameInfoValueType_Sym) {
    Sym::Dump(&((this->function).field_1.sym)->super_Sym,ValueType::Uninitialized);
    Output::Print(L" ");
  }
  Output::Print(L"args: ");
  JsUtil::
  List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Map<InlineeFrameInfo::Dump()const::__0>
            ((List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->arguments);
  return;
}

Assistant:

void InlineeFrameInfo::Dump() const
{
    Output::Print(_u("func: "));
    if (this->function.type == InlineeFrameInfoValueType_Const)
    {
        Output::Print(_u("%p(Var) "), this->function.constValue);
    }
    else if (this->function.type == InlineeFrameInfoValueType_Sym)
    {
        this->function.sym->Dump();
        Output::Print(_u(" "));
    }

    Output::Print(_u("args: "));
    arguments->Map([=](uint i, InlineFrameInfoValue& value)
    {
        if (value.type == InlineeFrameInfoValueType_Const)
        {
            Output::Print(_u("%p(Var) "), value.constValue);
        }
        else if (value.type == InlineeFrameInfoValueType_Sym)
        {
            value.sym->Dump();
            Output::Print(_u(" "));
        }
        Output::Print(_u(", "));
    });
}